

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O0

bool __thiscall
Minisat::SimpSolver::merge
          (SimpSolver *this,Clause *_ps,Clause *_qs,Var_conflict v,
          vec<Minisat::Lit,_int> *out_clause)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Lit LVar4;
  int in_ECX;
  Clause *in_RDX;
  Clause *in_RSI;
  long in_RDI;
  Lit *in_R8;
  int i_1;
  int j;
  int i;
  Clause *qs;
  Clause *ps;
  bool ps_smallest;
  Lit *in_stack_ffffffffffffff48;
  Lit *elem;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  Clause *local_90;
  Clause *local_88;
  int local_70;
  Lit local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  Clause *local_48;
  Clause *local_40;
  undefined1 local_31;
  Lit *local_30;
  int local_24;
  Clause *local_20;
  Clause *local_18;
  
  *(int *)(in_RDI + 0x374) = *(int *)(in_RDI + 0x374) + 1;
  local_30 = in_R8;
  local_24 = in_ECX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  vec<Minisat::Lit,_int>::clear
            ((vec<Minisat::Lit,_int> *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50)
             ,SUB81((ulong)in_stack_ffffffffffffff48 >> 0x38,0));
  iVar2 = Clause::size(local_18);
  iVar3 = Clause::size(local_20);
  local_31 = iVar2 < iVar3;
  if ((bool)local_31) {
    local_88 = local_20;
  }
  else {
    local_88 = local_18;
  }
  local_40 = local_88;
  if ((bool)local_31) {
    local_90 = local_18;
  }
  else {
    local_90 = local_20;
  }
  local_48 = local_90;
  local_4c = 0;
  do {
    iVar2 = local_4c;
    iVar3 = Clause::size(local_48);
    if (iVar3 <= iVar2) {
      local_70 = 0;
      while (iVar2 = local_70, iVar3 = Clause::size(local_40), iVar2 < iVar3) {
        LVar4 = Clause::operator[](local_40,local_70);
        iVar3 = Minisat::var(LVar4);
        if (iVar3 != local_24) {
          elem = local_30;
          Clause::operator[](local_40,local_70);
          vec<Minisat::Lit,_int>::push
                    ((vec<Minisat::Lit,_int> *)CONCAT44(iVar2,in_stack_ffffffffffffff50),elem);
        }
        local_70 = local_70 + 1;
      }
      return true;
    }
    local_50 = (int)Clause::operator[](local_48,local_4c);
    iVar2 = Minisat::var((Lit)local_50);
    if (iVar2 != local_24) {
      for (local_54 = 0; iVar2 = local_54, iVar3 = Clause::size(local_40), iVar2 < iVar3;
          local_54 = local_54 + 1) {
        local_58 = (int)Clause::operator[](local_40,local_54);
        iVar2 = Minisat::var((Lit)local_58);
        local_5c = (int)Clause::operator[](local_48,local_4c);
        iVar3 = Minisat::var((Lit)local_5c);
        if (iVar2 == iVar3) {
          local_60 = Clause::operator[](local_40,local_54);
          LVar4 = Clause::operator[](local_48,local_4c);
          LVar4 = operator~(LVar4);
          bVar1 = Lit::operator==(&local_60,LVar4);
          if (bVar1) {
            return false;
          }
          goto LAB_00a42028;
        }
      }
      Clause::operator[](local_48,local_4c);
      vec<Minisat::Lit,_int>::push
                ((vec<Minisat::Lit,_int> *)
                 CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                 in_stack_ffffffffffffff48);
    }
LAB_00a42028:
    local_4c = local_4c + 1;
  } while( true );
}

Assistant:

bool SimpSolver::merge(const Clause& _ps, const Clause& _qs, Var v, vec<Lit>& out_clause)
{
    merges++;
    out_clause.clear();

    bool  ps_smallest = _ps.size() < _qs.size();
    const Clause& ps  =  ps_smallest ? _qs : _ps;
    const Clause& qs  =  ps_smallest ? _ps : _qs;

    for (int i = 0; i < qs.size(); i++){
        if (var(qs[i]) != v){
            for (int j = 0; j < ps.size(); j++)
                if (var(ps[j]) == var(qs[i])){
                    if (ps[j] == ~qs[i])
                        return false;
                    else
                        goto next;
                }
            out_clause.push(qs[i]);
        }
        next:;
    }

    for (int i = 0; i < ps.size(); i++)
        if (var(ps[i]) != v)
            out_clause.push(ps[i]);

    return true;
}